

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgsortLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  uint32 __val;
  long __val_00;
  bool bVar1;
  ArgSortLayerParams *pAVar2;
  Type *pTVar3;
  Result *_result;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Argsort",(allocator<char> *)&err);
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_68,&this->blobNameToRank);
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  pAVar2 = Specification::NeuralNetworkLayer::argsort(layer);
  if (pAVar2->axis_ < 0) {
    std::operator+(&local_128,
                   "Value of \'axis\' is negative for layer of type \'ArgSort\' and name \'",
                   (layer->name_).ptr_);
    std::operator+(&err,&local_128,"\', which is not supported. It must be positive.");
    std::__cxx11::string::~string((string *)&local_128);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_00288544:
    std::__cxx11::string::~string((string *)&err);
  }
  else {
    if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                         (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
      __val = pTVar3->rank_;
      __val_00 = pAVar2->axis_;
      if ((__val_00 < 0) || ((int)__val <= __val_00)) {
        std::__cxx11::to_string(&local_48,__val_00);
        std::operator+(&local_e8,"Value of \'axis\' is ",&local_48);
        std::operator+(&local_c8,&local_e8,", but it must be in the range [0,");
        std::__cxx11::to_string(&local_108,__val);
        std::operator+(&local_a8,&local_c8,&local_108);
        std::operator+(&local_88,&local_a8,") for layer of type \'ArgSort\' and name \'");
        std::operator+(&local_128,&local_88,(layer->name_).ptr_);
        std::operator+(&err,&local_128,"\'.");
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_48);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        goto LAB_00288544;
      }
    }
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgsortLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Argsort", blobNameToRank));

    const auto& params = layer.argsort();

    if (params.axis() < 0) {
        const std::string err = "Value of 'axis' is negative for layer of type 'ArgSort' and name '" + layer.name() + "', which is not supported. It must be positive.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < 0 || params.axis() >= rank) {
            const std::string err = "Value of 'axis' is " + std::to_string(params.axis()) + \
                                    ", but it must be in the range [0," \
                                    + std::to_string(rank) + ") for layer of type 'ArgSort' and name '" + layer.name() + "'.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}